

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevolute.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkRevolute::IntLoadConstraint_C
          (ChLinkRevolute *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  ulong uVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined8 uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar12 [32];
  
  uVar5 = (ulong)off_L;
  iVar4 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar4 == '\0') {
    return;
  }
  auVar10._0_8_ =
       c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data
           .array[0];
  auVar10._8_8_ =
       c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data
           .array[1];
  auVar10._16_8_ =
       c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data
           .array[2];
  auVar10._24_8_ =
       c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data
           .array[3];
  dVar8 = c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
              m_data.array[4];
  if (do_clamp) {
    auVar3._8_8_ = in_XMM1_Qb;
    auVar3._0_8_ = recovery_clamp;
    auVar11._8_8_ = recovery_clamp;
    auVar11._0_8_ = recovery_clamp;
    auVar12._16_8_ = recovery_clamp;
    auVar12._0_16_ = auVar11;
    auVar12._24_8_ = recovery_clamp;
    auVar7._8_8_ = 0x8000000000000000;
    auVar7._0_8_ = 0x8000000000000000;
    auVar7 = vxorpd_avx512vl(auVar11,auVar7);
    uVar13 = auVar7._0_8_;
    auVar14._8_8_ = uVar13;
    auVar14._0_8_ = uVar13;
    auVar14._16_8_ = uVar13;
    auVar14._24_8_ = uVar13;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar8;
    auVar7 = vmaxsd_avx(auVar9,auVar7);
    auVar10 = vmaxpd_avx(auVar10,auVar14);
    auVar7 = vminsd_avx(auVar7,auVar3);
    dVar8 = auVar7._0_8_;
    auVar10 = vminpd_avx(auVar10,auVar12);
  }
  uVar1 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar5 < (long)uVar1) {
    pdVar2 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar2[uVar5] = auVar10._0_8_ + pdVar2[uVar5];
    uVar5 = (ulong)(off_L + 1);
    if (uVar5 < uVar1) {
      auVar7 = vshufpd_avx(auVar10._0_16_,auVar10._0_16_,1);
      pdVar2[uVar5] = auVar7._0_8_ + pdVar2[uVar5];
      uVar5 = (ulong)(off_L + 2);
      if (uVar5 < uVar1) {
        pdVar2[uVar5] = auVar10._16_8_ + pdVar2[uVar5];
        uVar5 = (ulong)(off_L + 3);
        if (uVar5 < uVar1) {
          auVar7 = vshufpd_avx(auVar10._16_16_,auVar10._16_16_,1);
          uVar6 = (ulong)(off_L + 4);
          pdVar2[uVar5] = auVar7._0_8_ + pdVar2[uVar5];
          if (uVar6 < uVar1) {
            pdVar2[uVar6] = dVar8 + pdVar2[uVar6];
            return;
          }
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChLinkRevolute::IntLoadConstraint_C(const unsigned int off_L,  ///< offset in Qc residual
                                         ChVectorDynamic<>& Qc,     ///< result: the Qc residual, Qc += c*C
                                         const double c,            ///< a scaling factor
                                         bool do_clamp,             ///< apply clamping to c*C?
                                         double recovery_clamp      ///< value for min/max clamping of c*C
                                         ) {
    if (!IsActive())
        return;

    double cnstr_x_violation = c * m_C(0);
    double cnstr_y_violation = c * m_C(1);
    double cnstr_z_violation = c * m_C(2);
    double cnstr_uw_violation = c * m_C(3);
    double cnstr_vw_violation = c * m_C(4);

    if (do_clamp) {
        cnstr_x_violation = ChMin(ChMax(cnstr_x_violation, -recovery_clamp), recovery_clamp);
        cnstr_y_violation = ChMin(ChMax(cnstr_y_violation, -recovery_clamp), recovery_clamp);
        cnstr_z_violation = ChMin(ChMax(cnstr_z_violation, -recovery_clamp), recovery_clamp);
        cnstr_uw_violation = ChMin(ChMax(cnstr_uw_violation, -recovery_clamp), recovery_clamp);
        cnstr_vw_violation = ChMin(ChMax(cnstr_vw_violation, -recovery_clamp), recovery_clamp);
    }
    Qc(off_L + 0) += cnstr_x_violation;
    Qc(off_L + 1) += cnstr_y_violation;
    Qc(off_L + 2) += cnstr_z_violation;
    Qc(off_L + 3) += cnstr_uw_violation;
    Qc(off_L + 4) += cnstr_vw_violation;
}